

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::DirectStateAccess::Framebuffers::RenderbufferAttachmentTest::Test
          (RenderbufferAttachmentTest *this,GLenum attachment,GLenum internalformat)

{
  int iVar1;
  deUint32 dVar2;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  TestContext *pTVar4;
  TestLog *pTVar5;
  MessageBuilder *pMVar6;
  Enum<int,_2UL> EVar7;
  Enum<int,_2UL> local_3b8;
  GetNameFunc local_3a8;
  int local_3a0;
  Enum<int,_2UL> local_398;
  MessageBuilder local_388;
  int local_204;
  GetNameFunc p_Stack_200;
  GLenum status;
  int local_1f8;
  Enum<int,_2UL> local_1f0;
  GetNameFunc local_1e0;
  int local_1d8;
  Enum<int,_2UL> local_1d0 [2];
  MessageBuilder local_1b0;
  int local_2c;
  long lStack_28;
  GLenum error;
  Functions *gl;
  GLenum internalformat_local;
  GLenum attachment_local;
  RenderbufferAttachmentTest *this_local;
  
  gl._0_4_ = internalformat;
  gl._4_4_ = attachment;
  _internalformat_local = this;
  pRVar3 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar3->_vptr_RenderContext[3])();
  lStack_28 = CONCAT44(extraout_var,iVar1);
  (**(code **)(lStack_28 + 0x6e8))(1,&this->m_rbo);
  dVar2 = (**(code **)(lStack_28 + 0x800))();
  glu::checkError(dVar2,"glGenRenderbuffers has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                  ,0x126);
  (**(code **)(lStack_28 + 0xa0))(0x8d41,this->m_rbo);
  dVar2 = (**(code **)(lStack_28 + 0x800))();
  glu::checkError(dVar2,"glBindRenderbuffer has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                  ,0x129);
  (**(code **)(lStack_28 + 0x1238))(0x8d41,(GLenum)gl,1);
  dVar2 = (**(code **)(lStack_28 + 0x800))();
  glu::checkError(dVar2,"glRenderbufferStorage has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                  ,300);
  (**(code **)(lStack_28 + 0xa0))(0x8d41,0);
  dVar2 = (**(code **)(lStack_28 + 0x800))();
  glu::checkError(dVar2,"glBindRenderbuffer has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                  ,0x12f);
  (**(code **)(lStack_28 + 0x3c0))(1,&this->m_fbo);
  dVar2 = (**(code **)(lStack_28 + 0x800))();
  glu::checkError(dVar2,"glCreateFramebuffers has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                  ,0x133);
  (**(code **)(lStack_28 + 0xf10))(this->m_fbo,gl._4_4_,0x8d41,this->m_rbo);
  local_2c = (**(code **)(lStack_28 + 0x800))();
  if (local_2c == 0) {
    (**(code **)(lStack_28 + 0x78))(0x8d40,this->m_fbo);
    dVar2 = (**(code **)(lStack_28 + 0x800))();
    glu::checkError(dVar2,"glBindFramebuffer has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                    ,0x142);
    local_204 = (**(code **)(lStack_28 + 0x170))(0x8d40);
    if (local_204 == 0x8cd5) {
      this_local._7_1_ = true;
    }
    else {
      pTVar4 = deqp::Context::getTestContext((this->super_TestCase).m_context);
      pTVar5 = tcu::TestContext::getLog(pTVar4);
      tcu::TestLog::operator<<(&local_388,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar6 = tcu::MessageBuilder::operator<<
                         (&local_388,
                          (char (*) [78])
                          "Named Framebuffer Renderbuffer Attachment test failed because of framebuffer "
                         );
      EVar7 = glu::getFramebufferStatusStr(local_204);
      local_3a8 = EVar7.m_getName;
      local_3a0 = EVar7.m_value;
      local_398.m_getName = local_3a8;
      local_398.m_value = local_3a0;
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_398);
      pMVar6 = tcu::MessageBuilder::operator<<
                         (pMVar6,(char (*) [30])" with renderbuffer set up as ");
      EVar7 = glu::getFramebufferAttachmentStr(gl._4_4_);
      local_3b8.m_getName = EVar7.m_getName;
      local_3b8.m_value = EVar7.m_value;
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_3b8);
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [13])0x2c62184);
      tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_388);
      this_local._7_1_ = false;
    }
  }
  else {
    pTVar4 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    pTVar5 = tcu::TestContext::getLog(pTVar4);
    tcu::TestLog::operator<<(&local_1b0,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar6 = tcu::MessageBuilder::operator<<
                       (&local_1b0,(char (*) [34])"NamedFramebufferRenderbuffer for ");
    EVar7 = glu::getFramebufferAttachmentStr(gl._4_4_);
    local_1e0 = EVar7.m_getName;
    local_1d8 = EVar7.m_value;
    local_1d0[0].m_getName = local_1e0;
    local_1d0[0].m_value = local_1d8;
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,local_1d0);
    pMVar6 = tcu::MessageBuilder::operator<<
                       (pMVar6,(char (*) [37])" attachment failed with error value ");
    EVar7 = glu::getErrorStr(local_2c);
    p_Stack_200 = EVar7.m_getName;
    local_1f8 = EVar7.m_value;
    local_1f0.m_getName = p_Stack_200;
    local_1f0.m_value = local_1f8;
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_1f0);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [2])0x2b6cb9a);
    tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1b0);
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool RenderbufferAttachmentTest::Test(glw::GLenum attachment, glw::GLenum internalformat)
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* RBO creation. */
	gl.genRenderbuffers(1, &m_rbo);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenRenderbuffers has failed");

	gl.bindRenderbuffer(GL_RENDERBUFFER, m_rbo);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindRenderbuffer has failed");

	gl.renderbufferStorage(GL_RENDERBUFFER, internalformat, 1, 1);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glRenderbufferStorage has failed");

	gl.bindRenderbuffer(GL_RENDERBUFFER, 0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindRenderbuffer has failed");

	/* FBO creation. */
	gl.createFramebuffers(1, &m_fbo);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateFramebuffers has failed");

	gl.namedFramebufferRenderbuffer(m_fbo, attachment, GL_RENDERBUFFER, m_rbo);

	if (glw::GLenum error = gl.getError())
	{
		m_context.getTestContext().getLog() << tcu::TestLog::Message << "NamedFramebufferRenderbuffer for "
											<< glu::getFramebufferAttachmentStr(attachment)
											<< " attachment failed with error value " << glu::getErrorStr(error) << "."
											<< tcu::TestLog::EndMessage;

		return false;
	}

	gl.bindFramebuffer(GL_FRAMEBUFFER, m_fbo);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindFramebuffer has failed");

	glw::GLenum status = gl.checkFramebufferStatus(GL_FRAMEBUFFER);

	if (GL_FRAMEBUFFER_COMPLETE != status)
	{
		m_context.getTestContext().getLog()
			<< tcu::TestLog::Message << "Named Framebuffer Renderbuffer Attachment test failed because of framebuffer "
			<< glu::getFramebufferStatusStr(status) << " with renderbuffer set up as "
			<< glu::getFramebufferAttachmentStr(attachment) << " attachment." << tcu::TestLog::EndMessage;

		return false;
	}

	return true;
}